

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O2

IWindowPtr __thiscall cursespp::LayoutBase::GetFocusableAt(LayoutBase *this,int index)

{
  __shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  IWindowPtr IVar2;
  
  p_Var1 = &std::
            vector<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
            ::at((vector<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
                  *)(CONCAT44(in_register_00000034,index) + 0x1e0),(long)in_EDX)->
            super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var1);
  IVar2.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar2.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar2.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IWindowPtr LayoutBase::GetFocusableAt(int index) {
    return this->focusable.at(index);
}